

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TxFormats.cpp
# Opt level: O3

void __thiscall jbcoin::TxFormats::addCommonFields(TxFormats *this,Item *item)

{
  SOElement local_f8;
  SOElement local_e8;
  SOElement local_d8;
  SOElement local_c8;
  SOElement local_b8;
  SOElement local_a8;
  SOElement local_98;
  SOElement local_88;
  SOElement local_78;
  SOElement local_68;
  SOElement local_58;
  SOElement local_48;
  SOElement local_38;
  SOElement local_28;
  
  local_28.e_field = (SField *)&sfTransactionType;
  local_28.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_28);
  local_38.e_field = (SField *)sfFlags;
  local_38.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&item->elements,&local_38);
  local_48.e_field = (SField *)sfSourceTag;
  local_48.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&item->elements,&local_48);
  local_58.e_field = (SField *)sfAccount;
  local_58.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_58);
  local_68.e_field = (SField *)sfSequence;
  local_68.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_68);
  local_78.e_field = (SField *)sfPreviousTxnID;
  local_78.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&item->elements,&local_78);
  local_88.e_field = (SField *)sfLastLedgerSequence;
  local_88.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&item->elements,&local_88);
  local_98.e_field = (SField *)sfAccountTxnID;
  local_98.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&item->elements,&local_98);
  local_a8.e_field = (SField *)sfFee;
  local_a8.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_a8);
  local_b8.e_field = (SField *)sfOperationLimit;
  local_b8.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&item->elements,&local_b8);
  local_c8.e_field = (SField *)sfMemos;
  local_c8.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&item->elements,&local_c8);
  local_d8.e_field = (SField *)sfSigningPubKey;
  local_d8.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_d8);
  local_e8.e_field = (SField *)sfTxnSignature;
  local_e8.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&item->elements,&local_e8);
  local_f8.e_field = (SField *)sfSigners;
  local_f8.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&item->elements,&local_f8);
  return;
}

Assistant:

void TxFormats::addCommonFields (Item& item)
{
    item
        << SOElement(sfTransactionType,     SOE_REQUIRED)
        << SOElement(sfFlags,               SOE_OPTIONAL)
        << SOElement(sfSourceTag,           SOE_OPTIONAL)
        << SOElement(sfAccount,             SOE_REQUIRED)
        << SOElement(sfSequence,            SOE_REQUIRED)
        << SOElement(sfPreviousTxnID,       SOE_OPTIONAL) // emulate027
        << SOElement(sfLastLedgerSequence,  SOE_OPTIONAL)
        << SOElement(sfAccountTxnID,        SOE_OPTIONAL)
        << SOElement(sfFee,                 SOE_REQUIRED)
        << SOElement(sfOperationLimit,      SOE_OPTIONAL)
        << SOElement(sfMemos,               SOE_OPTIONAL)
        << SOElement(sfSigningPubKey,       SOE_REQUIRED)
        << SOElement(sfTxnSignature,        SOE_OPTIONAL)
        << SOElement(sfSigners,             SOE_OPTIONAL) // submit_multisigned
        ;
}